

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vauth.c
# Opt level: O1

_Bool Curl_auth_allowed_to_host(Curl_easy *data)

{
  char *first;
  connectdata *pcVar1;
  _Bool _Var2;
  int iVar3;
  
  _Var2 = true;
  if ((((data->state).field_0x6d0 & 2) != 0) && (((data->set).field_0x8e4 & 0x20) == 0)) {
    first = (data->state).first_host;
    if (first != (char *)0x0) {
      pcVar1 = data->conn;
      iVar3 = Curl_strcasecompare(first,(pcVar1->host).name);
      if ((iVar3 != 0) && ((data->state).first_remote_port == pcVar1->remote_port)) {
        return (data->state).first_remote_protocol == pcVar1->handler->protocol;
      }
    }
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool Curl_auth_allowed_to_host(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  return (!data->state.this_is_a_follow ||
          data->set.allow_auth_to_other_hosts ||
          (data->state.first_host &&
           strcasecompare(data->state.first_host, conn->host.name) &&
           (data->state.first_remote_port == conn->remote_port) &&
           (data->state.first_remote_protocol == conn->handler->protocol)));
}